

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O0

uint16_t eia608_control_command(eia608_control_t cmd,int cc)

{
  uint in_EDI;
  uint16_t f;
  uint16_t c;
  uint16_t local_2;
  
  if ((in_EDI & 0xffc0) == 0x1720) {
    local_2 = eia608_parity(0);
  }
  else {
    local_2 = eia608_parity(0);
  }
  return local_2;
}

Assistant:

uint16_t eia608_control_command(eia608_control_t cmd, int cc)
{
    uint16_t c = (cc & 0x01) ? 0x0800 : 0x0000;
    uint16_t f = (cc & 0x02) ? 0x0100 : 0x0000;

    if (eia608_tab_offset_0 == (eia608_control_t)(cmd & 0xFFC0)) {
        return (eia608_control_t)eia608_parity(cmd | c);
    } else {
        return (eia608_control_t)eia608_parity(cmd | c | f);
    }
}